

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDFace *f,ON_SubDFaceParameter fp)

{
  unsigned_short uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_48;
  anon_union_8_3_7b68a318_for_m_p1 aStack_40;
  ON_SubDComponentId local_38;
  ON_SubDComponentId local_30;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  ON_SubDComponentId::ON_SubDComponentId(&local_30,f);
  bVar2 = Internal_Init(this,local_30);
  uVar1 = fp.m_cdex.m_corner_index;
  if ((((bVar2) && (2 < fp.m_cdex.m_edge_count && fp.m_cdex.m_corner_index < fp.m_cdex.m_edge_count)
       ) && (0.0 <= fp.m_s)) && (((fp.m_s <= 0.5 && (0.0 <= fp.m_t)) && (fp.m_t <= 0.5)))) {
    uVar4 = (uint)fp.m_cdex.m_edge_count;
    if (0x2ffff < CONCAT22(fp.m_cdex.m_edge_count,fp.m_cdex.m_corner_index) &&
        fp.m_cdex.m_corner_index < fp.m_cdex.m_edge_count) {
      uVar3 = ON_SubDFace::EdgeCount(f);
      if (uVar4 == uVar3) {
        _local_48 = ON_SubDFaceParameter::FaceCornerParameters(&fp);
        bVar2 = ON_2dPoint::IsValid((ON_2dPoint *)&local_48.v_active_e);
        if (bVar2) {
          ON_SubDComponentId::ON_SubDComponentId(&local_38,f,(uint)uVar1);
          this->m_cid = local_38;
          this->m_p0 = local_48;
          this->m_p1 = aStack_40;
        }
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDFace* f,
  ON_SubDFaceParameter fp
)
{
  if (Internal_Init(ON_SubDComponentId(f)) && fp.IsSet())
  {
    const ON_SubDFaceCornerDex cdex = fp.FaceCornerDex();
    if (cdex.IsSet() && cdex.EdgeCount() == f->EdgeCount())
    {
      const ON_2dPoint p = fp.FaceCornerParameters();
      if (p.IsValid())
      {
        this->m_cid = ON_SubDComponentId(f, cdex.CornerIndex());
        this->m_p0.f_corner_s = p.x;
        this->m_p1.f_corner_t = p.y;
      }
    }
  }
}